

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

char * Curl_copy_header_value(char *header)

{
  byte *__s;
  char cVar1;
  byte bVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  size_t sVar5;
  char *pcVar6;
  byte *pbVar7;
  byte *__n;
  long lVar8;
  
  for (lVar8 = 0; (cVar1 = header[lVar8], cVar1 != '\0' && (cVar1 != ':')); lVar8 = lVar8 + 1) {
  }
  pcVar6 = header + (cVar1 != '\0');
  while ((bVar2 = pcVar6[lVar8], (ulong)bVar2 != 0 &&
         (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (ulong)bVar2 * 2 + 1) & 0x20) != 0)
         )) {
    lVar8 = lVar8 + 1;
  }
  __s = (byte *)(pcVar6 + lVar8);
  pbVar4 = (byte *)strchr((char *)__s,0xd);
  if ((pbVar4 == (byte *)0x0) && (pbVar4 = (byte *)strchr((char *)__s,10), pbVar4 == (byte *)0x0)) {
    sVar5 = strlen((char *)__s);
    pbVar4 = __s + sVar5;
  }
  pbVar7 = pbVar4 + (-lVar8 - (long)pcVar6) + 2;
  __n = pbVar4 + (-lVar8 - (long)pcVar6) + 1;
  while ((__s < pbVar4 &&
         (ppuVar3 = __ctype_b_loc(),
         (*(byte *)((long)*ppuVar3 + (ulong)*pbVar4 * 2 + 1) & 0x20) != 0))) {
    pbVar4 = pbVar4 + -1;
    pbVar7 = pbVar7 + -1;
    __n = __n + -1;
  }
  pcVar6 = (char *)(*Curl_cmalloc)((size_t)pbVar7);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    memcpy(pcVar6,__s,(size_t)__n);
    pcVar6[(long)__n] = '\0';
  }
  return pcVar6;
}

Assistant:

char *Curl_copy_header_value(const char *header)
{
  const char *start;
  const char *end;
  char *value;
  size_t len;

  DEBUGASSERT(header);

  /* Find the end of the header name */
  while(*header && (*header != ':'))
    ++header;

  if(*header)
    /* Skip over colon */
    ++header;

  /* Find the first non-space letter */
  start = header;
  while(*start && ISSPACE(*start))
    start++;

  /* data is in the host encoding so
     use '\r' and '\n' instead of 0x0d and 0x0a */
  end = strchr(start, '\r');
  if(!end)
    end = strchr(start, '\n');
  if(!end)
    end = strchr(start, '\0');
  if(!end)
    return NULL;

  /* skip all trailing space letters */
  while((end > start) && ISSPACE(*end))
    end--;

  /* get length of the type */
  len = end - start + 1;

  value = malloc(len + 1);
  if(!value)
    return NULL;

  memcpy(value, start, len);
  value[len] = 0; /* zero terminate */

  return value;
}